

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermIterators.hpp
# Opt level: O0

void __thiscall Kernel::VariableIterator::VariableIterator(VariableIterator *this,TermList t)

{
  bool bVar1;
  TermList TVar2;
  Term *this_00;
  _func_int **in_RSI;
  IteratorCore<Kernel::TermList> *in_RDI;
  Term *term;
  TermList *in_stack_ffffffffffffff78;
  Stack<const_Kernel::TermList_*> *in_stack_ffffffffffffff80;
  Stack<const_Kernel::TermList_*> *this_01;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  Stack<const_Kernel::TermList_*> *in_stack_ffffffffffffff90;
  int *local_48;
  
  Lib::IteratorCore<Kernel::TermList>::IteratorCore(in_RDI);
  in_RDI->_vptr_IteratorCore = (_func_int **)&PTR__VariableIterator_013203b0;
  Lib::Stack<const_Kernel::TermList_*>::Stack
            (in_stack_ffffffffffffff90,
             CONCAT17(in_stack_ffffffffffffff8f,
                      CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
  *(undefined1 *)&in_RDI[3]._vptr_IteratorCore = 0;
  local_48 = &in_RDI[3]._refCnt;
  do {
    TermList::TermList((TermList *)local_48);
    local_48 = local_48 + 2;
  } while (local_48 != &in_RDI[4]._refCnt);
  bVar1 = TermList::isVar((TermList *)in_stack_ffffffffffffff80);
  if (bVar1) {
    TVar2 = TermList::empty();
    *(uint64_t *)&in_RDI[3]._refCnt = TVar2._content;
    in_RDI[4]._vptr_IteratorCore = in_RSI;
    Lib::Stack<const_Kernel::TermList_*>::push(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    this_00 = TermList::term((TermList *)0x33d413);
    bVar1 = Term::shared((Term *)0x33d42e);
    if ((!bVar1) || (bVar1 = Term::ground((Term *)0x33d448), !bVar1)) {
      this_01 = (Stack<const_Kernel::TermList_*> *)(in_RDI + 1);
      Term::args(this_00);
      Lib::Stack<const_Kernel::TermList_*>::push(this_01,in_stack_ffffffffffffff78);
    }
  }
  return;
}

Assistant:

VariableIterator(TermList t) : _stack(8), _used(false)
  {
    if(t.isVar()) {
      // see #hack 1
      _aux[0] = TermList::empty();
      _aux[1]=t;
      _stack.push(&_aux[1]);
    }
    else {
      Term* term=t.term();
      if(!term->shared() || !term->ground()) {
	_stack.push(term->args());
      }
    }
  }